

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz77.c
# Opt level: O0

void ZopfliStoreLitLenDist
               (unsigned_short length,unsigned_short dist,size_t pos,ZopfliLZ77Store *store)

{
  ulong uVar1;
  int iVar2;
  long lVar3;
  long *in_RCX;
  long lVar4;
  undefined8 in_RDX;
  ushort in_SI;
  ushort in_DI;
  size_t dsize;
  size_t llsize;
  size_t dstart;
  size_t llstart;
  size_t origsize;
  size_t i;
  void *local_a0;
  void *local_98;
  void *local_90;
  void *local_88;
  void *local_80;
  void *local_78;
  void *local_70;
  undefined8 local_68;
  void *local_60;
  undefined8 local_58;
  void *local_50;
  ulong local_48;
  ulong local_40;
  ulong local_20;
  
  uVar1 = in_RCX[2];
  lVar3 = (uVar1 / 0x120) * 0x120;
  if (uVar1 % 0x120 == 0) {
    local_40 = uVar1;
    for (local_20 = 0; local_20 < 0x120; local_20 = local_20 + 1) {
      if ((local_40 & local_40 - 1) == 0) {
        if (local_40 == 0) {
          local_50 = malloc(8);
        }
        else {
          local_50 = realloc((void *)in_RCX[7],local_40 << 4);
        }
        in_RCX[7] = (long)local_50;
      }
      if (uVar1 == 0) {
        local_58 = 0;
      }
      else {
        local_58 = *(undefined8 *)(in_RCX[7] + ((uVar1 - 0x120) + local_20) * 8);
      }
      *(undefined8 *)(in_RCX[7] + local_40 * 8) = local_58;
      local_40 = local_40 + 1;
    }
  }
  if ((uVar1 & 0x1f) == 0) {
    local_48 = uVar1;
    for (local_20 = 0; local_20 < 0x20; local_20 = local_20 + 1) {
      if ((local_48 & local_48 - 1) == 0) {
        if (local_48 == 0) {
          local_60 = malloc(8);
        }
        else {
          local_60 = realloc((void *)in_RCX[8],local_48 << 4);
        }
        in_RCX[8] = (long)local_60;
      }
      if (uVar1 == 0) {
        local_68 = 0;
      }
      else {
        local_68 = *(undefined8 *)(in_RCX[8] + ((uVar1 - 0x20) + local_20) * 8);
      }
      *(undefined8 *)(in_RCX[8] + local_48 * 8) = local_68;
      local_48 = local_48 + 1;
    }
  }
  if ((in_RCX[2] & in_RCX[2] - 1U) == 0) {
    if (in_RCX[2] == 0) {
      local_70 = malloc(2);
    }
    else {
      local_70 = realloc((void *)*in_RCX,in_RCX[2] << 2);
    }
    *in_RCX = (long)local_70;
  }
  *(ushort *)(*in_RCX + in_RCX[2] * 2) = in_DI;
  in_RCX[2] = in_RCX[2] + 1;
  in_RCX[2] = uVar1;
  if ((in_RCX[2] & in_RCX[2] - 1U) == 0) {
    if (in_RCX[2] == 0) {
      local_78 = malloc(2);
    }
    else {
      local_78 = realloc((void *)in_RCX[1],in_RCX[2] << 2);
    }
    in_RCX[1] = (long)local_78;
  }
  *(ushort *)(in_RCX[1] + in_RCX[2] * 2) = in_SI;
  in_RCX[2] = in_RCX[2] + 1;
  in_RCX[2] = uVar1;
  if ((in_RCX[2] & in_RCX[2] - 1U) == 0) {
    if (in_RCX[2] == 0) {
      local_80 = malloc(8);
    }
    else {
      local_80 = realloc((void *)in_RCX[4],in_RCX[2] << 4);
    }
    in_RCX[4] = (long)local_80;
  }
  *(undefined8 *)(in_RCX[4] + in_RCX[2] * 8) = in_RDX;
  in_RCX[2] = in_RCX[2] + 1;
  if (in_SI == 0) {
    in_RCX[2] = uVar1;
    if ((in_RCX[2] & in_RCX[2] - 1U) == 0) {
      if (in_RCX[2] == 0) {
        local_88 = malloc(2);
      }
      else {
        local_88 = realloc((void *)in_RCX[5],in_RCX[2] << 2);
      }
      in_RCX[5] = (long)local_88;
    }
    *(ushort *)(in_RCX[5] + in_RCX[2] * 2) = in_DI;
    in_RCX[2] = in_RCX[2] + 1;
    in_RCX[2] = uVar1;
    if ((in_RCX[2] & in_RCX[2] - 1U) == 0) {
      if (in_RCX[2] == 0) {
        local_90 = malloc(2);
      }
      else {
        local_90 = realloc((void *)in_RCX[6],in_RCX[2] << 2);
      }
      in_RCX[6] = (long)local_90;
    }
    *(undefined2 *)(in_RCX[6] + in_RCX[2] * 2) = 0;
    in_RCX[2] = in_RCX[2] + 1;
    lVar3 = lVar3 + (ulong)in_DI;
    *(long *)(in_RCX[7] + lVar3 * 8) = *(long *)(in_RCX[7] + lVar3 * 8) + 1;
  }
  else {
    in_RCX[2] = uVar1;
    if ((in_RCX[2] & in_RCX[2] - 1U) == 0) {
      if (in_RCX[2] == 0) {
        local_98 = malloc(2);
      }
      else {
        local_98 = realloc((void *)in_RCX[5],in_RCX[2] << 2);
      }
      in_RCX[5] = (long)local_98;
    }
    iVar2 = ZopfliGetLengthSymbol((uint)in_DI);
    *(short *)(in_RCX[5] + in_RCX[2] * 2) = (short)iVar2;
    in_RCX[2] = in_RCX[2] + 1;
    in_RCX[2] = uVar1;
    if ((in_RCX[2] & in_RCX[2] - 1U) == 0) {
      if (in_RCX[2] == 0) {
        local_a0 = malloc(2);
      }
      else {
        local_a0 = realloc((void *)in_RCX[6],in_RCX[2] << 2);
      }
      in_RCX[6] = (long)local_a0;
    }
    iVar2 = ZopfliGetDistSymbol((uint)in_SI);
    *(short *)(in_RCX[6] + in_RCX[2] * 2) = (short)iVar2;
    in_RCX[2] = in_RCX[2] + 1;
    lVar4 = in_RCX[7];
    iVar2 = ZopfliGetLengthSymbol((uint)in_DI);
    lVar3 = lVar3 + iVar2;
    *(long *)(lVar4 + lVar3 * 8) = *(long *)(lVar4 + lVar3 * 8) + 1;
    lVar3 = in_RCX[8];
    iVar2 = ZopfliGetDistSymbol((uint)in_SI);
    lVar4 = (uVar1 & 0xffffffffffffffe0) + (long)iVar2;
    *(long *)(lVar3 + lVar4 * 8) = *(long *)(lVar3 + lVar4 * 8) + 1;
  }
  return;
}

Assistant:

void ZopfliStoreLitLenDist(unsigned short length, unsigned short dist,
                           size_t pos, ZopfliLZ77Store* store) {
  size_t i;
  /* Needed for using ZOPFLI_APPEND_DATA multiple times. */
  size_t origsize = store->size;
  size_t llstart = ZOPFLI_NUM_LL * (origsize / ZOPFLI_NUM_LL);
  size_t dstart = ZOPFLI_NUM_D * (origsize / ZOPFLI_NUM_D);

  /* Everytime the index wraps around, a new cumulative histogram is made: we're
  keeping one histogram value per LZ77 symbol rather than a full histogram for
  each to save memory. */
  if (origsize % ZOPFLI_NUM_LL == 0) {
    size_t llsize = origsize;
    for (i = 0; i < ZOPFLI_NUM_LL; i++) {
      ZOPFLI_APPEND_DATA(
          origsize == 0 ? 0 : store->ll_counts[origsize - ZOPFLI_NUM_LL + i],
          &store->ll_counts, &llsize);
    }
  }
  if (origsize % ZOPFLI_NUM_D == 0) {
    size_t dsize = origsize;
    for (i = 0; i < ZOPFLI_NUM_D; i++) {
      ZOPFLI_APPEND_DATA(
          origsize == 0 ? 0 : store->d_counts[origsize - ZOPFLI_NUM_D + i],
          &store->d_counts, &dsize);
    }
  }

  ZOPFLI_APPEND_DATA(length, &store->litlens, &store->size);
  store->size = origsize;
  ZOPFLI_APPEND_DATA(dist, &store->dists, &store->size);
  store->size = origsize;
  ZOPFLI_APPEND_DATA(pos, &store->pos, &store->size);
  assert(length < 259);

  if (dist == 0) {
    store->size = origsize;
    ZOPFLI_APPEND_DATA(length, &store->ll_symbol, &store->size);
    store->size = origsize;
    ZOPFLI_APPEND_DATA(0, &store->d_symbol, &store->size);
    store->ll_counts[llstart + length]++;
  } else {
    store->size = origsize;
    ZOPFLI_APPEND_DATA(ZopfliGetLengthSymbol(length),
                       &store->ll_symbol, &store->size);
    store->size = origsize;
    ZOPFLI_APPEND_DATA(ZopfliGetDistSymbol(dist),
                       &store->d_symbol, &store->size);
    store->ll_counts[llstart + ZopfliGetLengthSymbol(length)]++;
    store->d_counts[dstart + ZopfliGetDistSymbol(dist)]++;
  }
}